

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O1

bool check_dispel(int dis_level,CHAR_DATA *victim,int sn)

{
  AFFECT_DATA *pAVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  
  bVar2 = is_affected(victim,(int)gsn_indom);
  if (bVar2) {
    send_to_char("Your body\'s state is maintained by the force of your will.\n\r",victim);
  }
  else {
    bVar2 = is_affected(victim,sn);
    if (bVar2) {
      for (pAVar1 = victim->affected; pAVar1 != (AFFECT_DATA *)0x0; pAVar1 = pAVar1->next) {
        if ((pAVar1->type == sn) && (pAVar1->duration != -1)) {
          iVar4 = (pAVar1->level - dis_level) * 5;
          if (0x2f < iVar4) {
            iVar4 = 0x30;
          }
          if (iVar4 < -0x2c) {
            iVar4 = -0x2d;
          }
          iVar3 = number_percent();
          if ((iVar4 + 0x32 <= iVar3) && ((pAVar1->bitvector[0] & 0x1000000) == 0)) {
            switchD_002e4026::default(victim,sn);
            bVar2 = str_cmp(skill_table[sn].msg_off,"");
            if (bVar2) {
              send_to_char(skill_table[sn].msg_off,victim);
              send_to_char("\n\r",victim);
            }
            bVar2 = str_cmp(skill_table[sn].room_msg_off,"");
            if (!bVar2) {
              return true;
            }
            act(skill_table[sn].room_msg_off,victim,(void *)0x0,(void *)0x0,0);
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool check_dispel(int dis_level, CHAR_DATA *victim, int sn)
{
	AFFECT_DATA *af;

	if (is_affected(victim, gsn_indom))
	{
		send_to_char("Your body's state is maintained by the force of your will.\n\r", victim);
		return false;
	}

	if (is_affected(victim, sn))
	{
		for (af = victim->affected; af != nullptr; af = af->next)
		{
			if (af->type == sn)
			{
				if (!saves_dispel(dis_level, af->level, af->duration) && !IS_SET(af->bitvector, AFF_PERMANENT))
				{
					affect_strip(victim, sn);

					if (str_cmp(skill_table[sn].msg_off, ""))
					{
						send_to_char(skill_table[sn].msg_off, victim);
						send_to_char("\n\r", victim);
					}

					if (str_cmp(skill_table[sn].room_msg_off, ""))
						act(skill_table[sn].room_msg_off, victim, 0, 0, TO_ROOM);

					return true;
				}
			}
		}
	}

	return false;
}